

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixUtils.cpp
# Opt level: O1

HighsStatus
assessMatrixDimensions
          (HighsLogOptions *log_options,HighsInt num_vec,bool partitioned,
          vector<int,_std::allocator<int>_> *matrix_start,
          vector<int,_std::allocator<int>_> *matrix_p_end,
          vector<int,_std::allocator<int>_> *matrix_index,
          vector<double,_std::allocator<double>_> *matrix_value)

{
  HighsStatus HVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  if (num_vec < 0) {
    highsLogUser(log_options,kError,
                 "Matrix dimension validation fails on number of vectors = %d < 0\n",
                 (ulong)(uint)num_vec);
  }
  uVar4 = (ulong)((long)(matrix_start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(matrix_start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  iVar2 = (int)uVar4;
  if (iVar2 <= num_vec) {
    highsLogUser(log_options,kError,
                 "Matrix dimension validation fails on start size = %d < %d = num vectors + 1\n",
                 uVar4 & 0xffffffff,(ulong)(num_vec + 1));
  }
  bVar6 = -1 < num_vec && num_vec < iVar2;
  if (partitioned) {
    uVar4 = (ulong)((long)(matrix_p_end->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(matrix_p_end->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    if ((int)uVar4 <= num_vec) {
      highsLogUser(log_options,kError,
                   "Matrix dimension validation fails on p_end size = %d < %d = num vectors + 1\n",
                   uVar4,(ulong)(num_vec + 1));
    }
    bVar6 = bVar6 && num_vec < (int)((ulong)((long)(matrix_p_end->
                                                   super__Vector_base<int,_std::allocator<int>_>).
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)(matrix_p_end->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
  }
  uVar5 = 0;
  if (num_vec < iVar2) {
    uVar5 = (matrix_start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[num_vec];
  }
  if ((int)uVar5 < 0) {
    highsLogUser(log_options,kError,
                 "Matrix dimension validation fails on number of nonzeros = %d < 0\n",(ulong)uVar5);
    HVar1 = kError;
  }
  else {
    uVar4 = (ulong)((long)(matrix_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(matrix_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    iVar2 = (int)uVar4;
    if (iVar2 < (int)uVar5) {
      highsLogUser(log_options,kError,
                   "Matrix dimension validation fails on index size = %d < %d = number of nonzeros\n"
                   ,uVar4 & 0xffffffff,(ulong)uVar5);
    }
    uVar4 = (ulong)((long)(matrix_value->super__Vector_base<double,_std::allocator<double>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(matrix_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                         .super__Vector_impl_data._M_start) >> 3;
    iVar3 = (int)uVar4;
    if (iVar3 < (int)uVar5) {
      highsLogUser(log_options,kError,
                   "Matrix dimension validation fails on value size = %d < %d = number of nonzeros\n"
                   ,uVar4 & 0xffffffff,(ulong)uVar5);
    }
    HVar1 = -((byte)(~(bVar6 & (int)uVar5 <= iVar2) | iVar3 < (int)uVar5) & 1);
  }
  return HVar1;
}

Assistant:

HighsStatus assessMatrixDimensions(const HighsLogOptions& log_options,
                                   const HighsInt num_vec,
                                   const bool partitioned,
                                   const vector<HighsInt>& matrix_start,
                                   const vector<HighsInt>& matrix_p_end,
                                   const vector<HighsInt>& matrix_index,
                                   const vector<double>& matrix_value) {
  bool ok = true;
  // Assess main dimensions
  const bool legal_num_vec = num_vec >= 0;
  if (!legal_num_vec)
    highsLogUser(
        log_options, HighsLogType::kError,
        "Matrix dimension validation fails on number of vectors = %d < 0\n",
        (int)num_vec);
  ok = legal_num_vec && ok;
  const bool legal_matrix_start_size =
      (HighsInt)matrix_start.size() >= num_vec + 1;
  if (!legal_matrix_start_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "Matrix dimension validation fails on start size = %d < %d = "
                 "num vectors + 1\n",
                 (int)matrix_start.size(), (int)(num_vec + 1));
  ok = legal_matrix_start_size && ok;
  if (partitioned) {
    const bool legal_matrix_p_end_size =
        (HighsInt)matrix_p_end.size() >= num_vec + 1;
    if (!legal_matrix_p_end_size)
      highsLogUser(log_options, HighsLogType::kError,
                   "Matrix dimension validation fails on p_end size = %d < %d "
                   "= num vectors + 1\n",
                   (int)matrix_p_end.size(), (int)(num_vec + 1));
    ok = (HighsInt)matrix_p_end.size() >= num_vec + 1 && ok;
  }
  // Possibly check the sizes of the index and value vectors. Can only
  // do this with the number of nonzeros, and this is only known if
  // the start vector has a legal size. Setting num_nz = 0 otherwise
  // means that all tests pass, as they just check that the sizes of
  // the index and value vectors are non-negative.
  const HighsInt num_nz = legal_matrix_start_size ? matrix_start[num_vec] : 0;
  if (num_nz >= 0) {
    const bool legal_matrix_index_size =
        (HighsInt)matrix_index.size() >= num_nz;
    if (!legal_matrix_index_size)
      highsLogUser(log_options, HighsLogType::kError,
                   "Matrix dimension validation fails on index size = %d < %d "
                   "= number of nonzeros\n",
                   (int)matrix_index.size(), (int)num_nz);
    ok = legal_matrix_index_size && ok;
    const bool legal_matrix_value_size =
        (HighsInt)matrix_value.size() >= num_nz;
    if (!legal_matrix_value_size)
      highsLogUser(log_options, HighsLogType::kError,
                   "Matrix dimension validation fails on value size = %d < %d "
                   "= number of nonzeros\n",
                   (int)matrix_value.size(), (int)num_nz);
    ok = legal_matrix_value_size && ok;
  } else {
    highsLogUser(
        log_options, HighsLogType::kError,
        "Matrix dimension validation fails on number of nonzeros = %d < 0\n",
        (int)num_nz);
    ok = false;
  }
  if (ok) return HighsStatus::kOk;
  return HighsStatus::kError;
}